

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

bool __thiscall Query::operator==(Query *this,Query *other)

{
  pointer pQVar1;
  pointer pQVar2;
  bool bVar3;
  pointer other_00;
  pointer other_01;
  pointer this_00;
  pointer this_01;
  
  if (this->type != other->type) {
    return false;
  }
  this_00 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
            super__Vector_impl_data._M_start;
  pQVar1 = (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
           super__Vector_impl_data._M_finish;
  other_00 = (other->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((long)pQVar1 - (long)this_00 ==
      (long)(other->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)other_00) {
    for (; this_00 != pQVar1; this_00 = this_00 + 1) {
      bVar3 = QToken::operator==(this_00,other_00);
      if (!bVar3) {
        return false;
      }
      other_00 = other_00 + 1;
    }
    this_01 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
              super__Vector_impl_data._M_start;
    pQVar2 = (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    other_01 = (other->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((long)pQVar2 - (long)this_01 ==
        (long)(other->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)other_01) {
      if (this_01 == pQVar2) {
        return true;
      }
      do {
        bVar3 = operator==(this_01,other_01);
        if (!bVar3) {
          return bVar3;
        }
        this_01 = this_01 + 1;
        other_01 = other_01 + 1;
      } while (this_01 != pQVar2);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool Query::operator==(const Query &other) const {
    return type == other.type && value == other.value &&
           queries == other.queries;
}